

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::PrintTo(space_info *value,iu_ostream *os)

{
  ostream *poVar1;
  UInt64 value_00;
  UInt64 value_01;
  UInt64 value_02;
  string local_88;
  string local_68;
  string local_38;
  iu_ostream *local_18;
  iu_ostream *os_local;
  space_info *value_local;
  
  local_18 = os;
  os_local = (iu_ostream *)value;
  poVar1 = std::operator<<(os,"cpacity: ");
  FormatSizeByte_abi_cxx11_(&local_38,(detail *)os_local->_vptr_basic_ostream,value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,", free: ");
  FormatSizeByte_abi_cxx11_(&local_68,*(detail **)&os_local->field_0x8,value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  poVar1 = std::operator<<(poVar1,", available: ");
  FormatSizeByte_abi_cxx11_(&local_88,*(detail **)&os_local->field_0x10,value_02);
  std::operator<<(poVar1,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

inline void PrintTo(const ::std::filesystem::space_info& value, iu_ostream* os)
{
    *os << "cpacity: " << detail::FormatSizeByte(value.capacity)
        << ", free: " << detail::FormatSizeByte(value.free)
        << ", available: " << detail::FormatSizeByte(value.available);
}